

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_avx2.c
# Opt level: O0

halfchunk_t GET_HALFCHUNK_MAG(uint8_t *buf,uint32_t *chunk_rem,uint32_t dist)

{
  lut_rem_pair lVar1;
  byte bVar2;
  halfmask_t hVar3;
  uint in_EDX;
  undefined8 extraout_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar4 [16];
  halfchunk_t alVar5;
  halfmask_t load_mask;
  __m128i ret_vec;
  __m128i perm_vec;
  lut_rem_pair lut_rem;
  undefined8 local_98;
  undefined8 uStack_90;
  
  lVar1 = perm_idx_lut[in_EDX - 3];
  hVar3 = gen_half_mask(in_EDX);
  alVar5[1]._2_6_ = (undefined6)((ulong)extraout_RDX >> 0x10);
  alVar5[1]._0_2_ = hVar3;
  auVar4 = vmovdqu8_avx512vl(*in_RDI);
  bVar2 = (byte)(hVar3 >> 8);
  local_98._0_2_ = CONCAT11(((byte)(hVar3 >> 1) & 1) * auVar4[1],((byte)hVar3 & 1) * auVar4[0]);
  local_98._0_3_ = CONCAT12(((byte)(hVar3 >> 2) & 1) * auVar4[2],(undefined2)local_98);
  local_98._0_4_ = CONCAT13(((byte)(hVar3 >> 3) & 1) * auVar4[3],(undefined3)local_98);
  local_98._0_5_ = CONCAT14(((byte)(hVar3 >> 4) & 1) * auVar4[4],(undefined4)local_98);
  local_98._0_6_ = CONCAT15(((byte)(hVar3 >> 5) & 1) * auVar4[5],(undefined5)local_98);
  local_98._0_7_ = CONCAT16(((byte)(hVar3 >> 6) & 1) * auVar4[6],(undefined6)local_98);
  local_98 = CONCAT17(((byte)(hVar3 >> 7) & 1) * auVar4[7],(undefined7)local_98);
  uStack_90._0_1_ = (bVar2 & 1) * auVar4[8];
  uStack_90._1_1_ = (bVar2 >> 1 & 1) * auVar4[9];
  uStack_90._2_1_ = (bVar2 >> 2 & 1) * auVar4[10];
  uStack_90._3_1_ = (bVar2 >> 3 & 1) * auVar4[0xb];
  uStack_90._4_1_ = (bVar2 >> 4 & 1) * auVar4[0xc];
  uStack_90._5_1_ = (bVar2 >> 5 & 1) * auVar4[0xd];
  uStack_90._6_1_ = (bVar2 >> 6 & 1) * auVar4[0xe];
  uStack_90._7_1_ = -((char)bVar2 >> 7) * auVar4[0xf];
  *in_RSI = (uint)half_rem_vals[in_EDX - 3];
  alVar5[0] = (undefined1 (*) [16])("" + (int)((uint)lVar1 & 0xffff));
  auVar4._8_8_ = uStack_90;
  auVar4._0_8_ = local_98;
  vpshufb_avx(auVar4,*alVar5[0]);
  return alVar5;
}

Assistant:

static inline halfchunk_t GET_HALFCHUNK_MAG(uint8_t *buf, uint32_t *chunk_rem, uint32_t dist) {
    lut_rem_pair lut_rem = perm_idx_lut[dist - 3];
    __m128i perm_vec, ret_vec;
    __msan_unpoison(buf + dist, 16 - dist);
    ret_vec = _mm_loadu_si128((__m128i*)buf);
    *chunk_rem = half_rem_vals[dist - 3];

    perm_vec = _mm_load_si128((__m128i*)(permute_table + lut_rem.idx));
    ret_vec = _mm_shuffle_epi8(ret_vec, perm_vec);

    return ret_vec;
}